

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void rnn_freedb(rnndb *db)

{
  int local_14;
  int i;
  rnndb *db_local;
  
  for (local_14 = 0; local_14 < db->enumsnum; local_14 = local_14 + 1) {
    freeenum(db->enums[local_14]);
  }
  free(db->enums);
  for (local_14 = 0; local_14 < db->bitsetsnum; local_14 = local_14 + 1) {
    freebitset(db->bitsets[local_14]);
  }
  free(db->bitsets);
  for (local_14 = 0; local_14 < db->domainsnum; local_14 = local_14 + 1) {
    freedomain(db->domains[local_14]);
  }
  free(db->domains);
  for (local_14 = 0; local_14 < db->spectypesnum; local_14 = local_14 + 1) {
    freespectype(db->spectypes[local_14]);
  }
  free(db->spectypes);
  for (local_14 = 0; local_14 < db->groupsnum; local_14 = local_14 + 1) {
    freegroup(db->groups[local_14]);
  }
  free(db->groups);
  cleanupcopyright(&db->copyright);
  for (local_14 = 0; local_14 < db->filesnum; local_14 = local_14 + 1) {
    free(db->files[local_14]);
  }
  free(db->files);
  free(db);
  return;
}

Assistant:

void rnn_freedb (struct rnndb *db) {
	int i;

	for (i = 0; i < db->enumsnum; i++)
		freeenum(db->enums[i]);
	free(db->enums);

	for (i = 0; i < db->bitsetsnum; i++)
		freebitset(db->bitsets[i]);
	free(db->bitsets);

	for (i = 0; i < db->domainsnum; i++)
		freedomain(db->domains[i]);
	free(db->domains);

	for (i = 0; i < db->spectypesnum; i++)
		freespectype(db->spectypes[i]);
	free(db->spectypes);

	for (i = 0; i < db->groupsnum; i++)
		freegroup(db->groups[i]);
	free(db->groups);

	cleanupcopyright(&db->copyright);

	for (i = 0; i < db->filesnum; i++)
		free(db->files[i]);
	free(db->files);

	free(db);
}